

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O1

string * __thiscall
vkt::tessellation::anon_unknown_1::IOBlock::glslTraverseBasicTypeArray
          (string *__return_storage_ptr__,IOBlock *this,int numArrayElements,int indentationDepth,
          BasicTypeVisitFunc visit)

{
  pointer pcVar1;
  ostream *poVar2;
  long *plVar3;
  size_type *psVar4;
  long lVar5;
  long lVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string indentation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream result;
  string local_240;
  int local_21c;
  string local_218;
  string local_1f8;
  string *local_1d8;
  BasicTypeVisitFunc local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d8 = __return_storage_ptr__;
  local_1d0 = visit;
  if (numArrayElements < 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    if (0 < (int)((ulong)((long)(this->m_members).
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_members).
                               super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
      lVar6 = 0x20;
      lVar5 = 0;
      do {
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        pcVar1 = (this->m_interfaceName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,pcVar1,pcVar1 + (this->m_interfaceName)._M_string_length);
        std::__cxx11::string::append((char *)&local_1f8);
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1f8,
                                    *(ulong *)((long)(this->m_members).
                                                                                                          
                                                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                              lVar6 + -0x20));
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_240.field_2._M_allocated_capacity = *psVar4;
          local_240.field_2._8_8_ = plVar3[3];
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        }
        else {
          local_240.field_2._M_allocated_capacity = *psVar4;
          local_240._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_240._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        glslTraverseBasicTypes
                  (&local_218,&local_240,
                   (VarType *)
                   ((long)&(((this->m_members).
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                             ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                   lVar6),0,indentationDepth,local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x38;
      } while (lVar5 < (int)((ulong)((long)(this->m_members).
                                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->m_members).
                                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x49249249);
    }
    psVar7 = local_1d8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_218,(char)indentationDepth);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    local_21c = indentationDepth;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"for (int i0 = 0; i0 < ",0x16);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,numArrayElements);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"; ++i0)\n",8);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
    if (0 < (int)((ulong)((long)(this->m_members).
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_members).
                               super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
      local_21c = local_21c + 1;
      lVar6 = 0x20;
      lVar5 = 0;
      do {
        pcVar1 = (this->m_interfaceName)._M_dataplus._M_p;
        local_1c8[0] = local_1b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1c8,pcVar1,pcVar1 + (this->m_interfaceName)._M_string_length);
        std::__cxx11::string::append((char *)local_1c8);
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_1c8,
                                    *(ulong *)((long)(this->m_members).
                                                                                                          
                                                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                              lVar6 + -0x20));
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_1f8.field_2._M_allocated_capacity = *psVar4;
          local_1f8.field_2._8_8_ = plVar3[3];
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        }
        else {
          local_1f8.field_2._M_allocated_capacity = *psVar4;
          local_1f8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_1f8._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        glslTraverseBasicTypes
                  (&local_240,&local_1f8,
                   (VarType *)
                   ((long)&(((this->m_members).
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                             ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                   lVar6),1,local_21c,local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],local_1b8[0] + 1);
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x38;
      } while (lVar5 < (int)((ulong)((long)(this->m_members).
                                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->m_members).
                                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x49249249);
    }
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,local_218._M_dataplus._M_p,
               local_218._M_dataplus._M_p + local_218._M_string_length);
    std::__cxx11::string::append((char *)&local_240);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    psVar7 = local_1d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  return psVar7;
}

Assistant:

std::string IOBlock::glslTraverseBasicTypeArray (const int numArrayElements, const int indentationDepth, BasicTypeVisitFunc visit) const
{
	if (numArrayElements >= 0)
	{
		const std::string	indentation = std::string(indentationDepth, '\t');
		std::ostringstream	result;

		result << indentation << "for (int i0 = 0; i0 < " << numArrayElements << "; ++i0)\n"
			   << indentation << "{\n";
		for (int i = 0; i < static_cast<int>(m_members.size()); ++i)
			result << glslTraverseBasicTypes(m_interfaceName + "[i0]." + m_members[i].name, m_members[i].type, 1, indentationDepth + 1, visit);
		result << indentation + "}\n";
		return result.str();
	}
	else
	{
		std::ostringstream result;
		for (int i = 0; i < static_cast<int>(m_members.size()); ++i)
			result << glslTraverseBasicTypes(m_interfaceName + "[gl_InvocationID]." + m_members[i].name, m_members[i].type, 0, indentationDepth, visit);
		return result.str();
	}
}